

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Signal_PDU.cpp
# Opt level: O0

void __thiscall
KDIS::PDU::Signal_PDU::Decode(Signal_PDU *this,KDataStream *stream,bool ignoreHeader)

{
  KUINT16 KVar1;
  KException *this_00;
  KDataStream *pKVar2;
  int iVar3;
  short local_7c;
  char local_5b;
  ushort local_5a;
  ushort local_58;
  undefined1 local_55;
  KOCTET o;
  KUINT16 i;
  KUINT16 dl;
  allocator<char> local_41;
  KString local_40;
  byte local_19;
  KDataStream *pKStack_18;
  bool ignoreHeader_local;
  KDataStream *stream_local;
  Signal_PDU *this_local;
  
  local_19 = ignoreHeader;
  pKStack_18 = stream;
  stream_local = (KDataStream *)this;
  KVar1 = KDataStream::GetBufferSize(stream);
  iVar3 = 0;
  if ((local_19 & 1) != 0) {
    iVar3 = 0xc;
  }
  if ((uint)KVar1 + iVar3 < 0x20) {
    local_55 = 1;
    this_00 = (KException *)__cxa_allocate_exception(0x30);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_40,"Decode",&local_41);
    KException::KException(this_00,&local_40,2);
    local_55 = 0;
    __cxa_throw(this_00,&KException::typeinfo,KException::~KException);
  }
  Radio_Communications_Header::Decode
            (&this->super_Radio_Communications_Header,pKStack_18,(bool)(local_19 & 1));
  pKVar2 = DATA_TYPE::operator>>(pKStack_18,&(this->m_EncodingScheme).super_DataTypeBase);
  pKVar2 = KDataStream::operator>>(pKVar2,&this->m_ui32SampleRate);
  pKVar2 = KDataStream::operator>>(pKVar2,&this->m_ui16DataLength);
  KDataStream::operator>>(pKVar2,&this->m_ui16Samples);
  local_58 = this->m_ui16DataLength / 8;
  if ((uint)local_58 % 4 == 0) {
    local_7c = 0;
  }
  else {
    local_7c = 4 - local_58 % 4;
  }
  local_58 = local_58 + local_7c;
  for (local_5a = 0; local_5a < local_58; local_5a = local_5a + 1) {
    KDataStream::operator>>(pKStack_18,&local_5b);
    std::vector<char,_std::allocator<char>_>::push_back(&this->m_vData,&local_5b);
  }
  return;
}

Assistant:

void Signal_PDU::Decode(KDataStream &stream, bool ignoreHeader /*= true*/ ) noexcept(false)
{
    if( ( stream.GetBufferSize() + ( ignoreHeader ? Header::HEADER6_PDU_SIZE : 0 ) ) < SIGNAL_PDU_SIZE )throw KException( __FUNCTION__, NOT_ENOUGH_DATA_IN_BUFFER );

    Radio_Communications_Header::Decode( stream, ignoreHeader );

    stream >> KDIS_STREAM m_EncodingScheme
           >> m_ui32SampleRate
           >> m_ui16DataLength
           >> m_ui16Samples;

    KUINT16 dl =  m_ui16DataLength / 8;
    dl += ( dl % 4 == 0 ? 0 : ( 4 - dl % 4 ) ); // Add padding
    for( KUINT16 i = 0; i < dl; ++i )
    {
        KOCTET o;
        stream >> o;
        m_vData.push_back( o );
    }
}